

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# latency_collector.h
# Opt level: O3

void __thiscall ThreadTrackerItem::~ThreadTrackerItem(ThreadTrackerItem *this)

{
  _List_node_base *p_Var1;
  pointer pcVar2;
  _List_node_base *p_Var3;
  
  p_Var3 = (this->lenStack).super__List_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           _M_node.super__List_node_base._M_next;
  while (p_Var3 != (_List_node_base *)&this->lenStack) {
    p_Var1 = p_Var3->_M_next;
    operator_delete(p_Var3);
    p_Var3 = p_Var1;
  }
  pcVar2 = (this->aggrStackNameRaw).super__Vector_base<char,_std::allocator<char>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (pcVar2 == (pointer)0x0) {
    return;
  }
  operator_delete(pcVar2);
  return;
}

Assistant:

ThreadTrackerItem()
        : numStacks(0),
          aggrStackNameRaw(4096),
          lenName(0)
        {}